

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O2

Vector4f __thiscall Vector4f::normalized(Vector4f *this)

{
  undefined1 auVar1 [16];
  int in_ESI;
  undefined4 in_register_00000034;
  undefined4 in_XMM0_Da;
  undefined1 auVar2 [16];
  Vector4f VVar3;
  
  abs((Vector4f *)CONCAT44(in_register_00000034,in_ESI),in_ESI);
  auVar1 = *(undefined1 (*) [16])CONCAT44(in_register_00000034,in_ESI);
  auVar2._4_4_ = in_XMM0_Da;
  auVar2._0_4_ = in_XMM0_Da;
  auVar2._8_4_ = in_XMM0_Da;
  auVar2._12_4_ = in_XMM0_Da;
  auVar2 = vdivps_avx(auVar1,auVar2);
  *(undefined1 (*) [16])this->m_elements = auVar2;
  VVar3.m_elements._0_8_ = auVar2._0_8_;
  VVar3.m_elements._8_8_ = auVar1._0_8_;
  return (Vector4f)VVar3.m_elements;
}

Assistant:

Vector4f Vector4f::normalized() const
{
	float length = abs();
	return Vector4f
		(
			m_elements[0] / length,
			m_elements[1] / length,
			m_elements[2] / length,
			m_elements[3] / length
		);
}